

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

size_t __thiscall pybind11::sequence::size(sequence *this)

{
  size_t sVar1;
  error_already_set *this_00;
  
  sVar1 = PySequence_Size((this->super_object).super_handle.m_ptr);
  if (sVar1 != 0xffffffffffffffff) {
    return sVar1;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

size_t size() const {
        ssize_t result = PySequence_Size(m_ptr);
        if (result == -1)
            throw error_already_set();
        return (size_t) result;
    }